

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyncExecutor.h
# Opt level: O3

void __thiscall nrg::SyncExecutor::operator()(SyncExecutor *this,Function *fn)

{
  exception *peVar1;
  undefined8 uVar2;
  undefined1 auVar3 [12];
  
  if ((fn->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*fn->_M_invoker)((_Any_data *)fn);
    return;
  }
  auVar3 = std::__throw_bad_function_call();
  uVar2 = auVar3._0_8_;
  if (auVar3._8_4_ == 1) {
    peVar1 = (exception *)__cxa_begin_catch(uVar2);
    if ((this->onError_).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->onError_)._M_invoker)((_Any_data *)this,peVar1);
      __cxa_end_catch();
      return;
    }
    uVar2 = std::__throw_bad_function_call();
    __cxa_end_catch();
  }
  _Unwind_Resume(uVar2);
}

Assistant:

void operator()(Function fn)
    {
        try {
            fn();
        }
        catch (ExceptionType& ex) {
            onError_(ex);
        }
    }